

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nick.cpp
# Opt level: O2

void __thiscall Enterprise::Nick::run_for(Nick *this,Cycles duration)

{
  uint16_t *puVar1;
  bool bVar2;
  int iVar3;
  uint8_t *puVar4;
  short sVar5;
  uint8_t uVar6;
  uint16_t uVar7;
  Mode MVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  WrappedInt<Cycles> WVar12;
  uint16_t *puVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  byte bVar17;
  OutputType OVar18;
  uint16_t *target;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  WrappedInt<Cycles> WVar24;
  long lVar25;
  uint uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  
  WVar12.length_ = 0x7fffffff;
  if ((long)duration.super_WrappedInt<Cycles>.length_ < 0x7fffffff) {
    WVar12 = duration.super_WrappedInt<Cycles>.length_;
  }
  WVar24.length_ = 0xffffffff80000000;
  if (-0x80000000 < WVar12.length_) {
    WVar24.length_ = WVar12.length_;
  }
  puVar1 = this->palette_;
  do {
    do {
      iVar10 = (int)WVar24.length_;
      if (iVar10 == 0) {
        return;
      }
      uVar21 = this->horizontal_counter_;
      iVar11 = 0x390 - uVar21;
      if (iVar10 <= (int)(0x390 - uVar21)) {
        iVar11 = iVar10;
      }
      uVar26 = (int)uVar21 >> 4;
      uVar19 = (int)(iVar11 + uVar21) >> 4;
      WVar24.length_ = (IntType)(uint)(iVar10 - iVar11);
      this->horizontal_counter_ = (int)(iVar11 + uVar21) % 0x390;
    } while (uVar26 == uVar19);
    if (uVar21 < 0x10) {
      set_output_type(this,Sync,false);
      if (this->left_margin_ == 0) {
        this->is_sync_or_pixels_ = true;
      }
      if (this->right_margin_ == 0) {
        this->is_sync_or_pixels_ = false;
      }
    }
    this->last_read_ = 0xff;
    uVar21 = 4;
    if ((int)uVar19 < 4) {
      uVar21 = uVar19;
    }
    bVar2 = this->should_reload_line_parameters_;
    puVar4 = this->ram_;
    uVar22 = (ulong)this->line_parameter_pointer_;
    uVar20 = uVar26;
    while ((int)uVar20 < (int)uVar21) {
      if ((bVar2 & 1U) == 0) goto switchD_003056ba_default;
      switch(uVar20) {
      case 0:
        this->lines_remaining_ = puVar4[uVar22];
        bVar17 = puVar4[uVar22 + 1];
        this->last_read_ = bVar17;
        this->interrupt_line_ = (bool)(bVar17 >> 7);
        MVar8 = puVar4[uVar22 + 1] >> 1 & LPixel;
        this->mode_ = MVar8;
        bVar17 = puVar4[uVar22 + 1] >> 5 & 3;
        iVar10 = 1 << bVar17;
        this->bpp_ = iVar10;
        if (MVar8 - CH256 < 3) {
LAB_00305724:
          uVar9 = (uint)(byte)(8 / (byte)iVar10);
          uVar27 = 1;
          uVar28 = 0;
        }
        else {
          uVar9 = 8;
          uVar27 = 1;
          uVar28 = 1;
          if (MVar8 != Attr) {
            if (MVar8 == LPixel) goto LAB_00305724;
            uVar9 = 0x10 >> bVar17;
            uVar27 = 2;
            uVar28 = 0;
          }
        }
        this->column_size_ = uVar9;
        *(ulong *)this->line_data_per_column_increments_ = CONCAT44(uVar28,uVar27);
        this->vres_ = (bool)(puVar4[uVar22 + 1] >> 4 & 1);
        this->reload_line_parameter_pointer_ = (bool)(puVar4[uVar22 + 1] & 1);
        break;
      case 1:
        this->left_margin_ = puVar4[uVar22 + 2] & 0x3f;
        this->right_margin_ = puVar4[uVar22 + 3] & 0x3f;
        bVar17 = puVar4[uVar22 + 3];
        this->last_read_ = bVar17;
        MVar8 = this->mode_;
        if (MVar8 - CH256 < 3) {
          this->alt_ind_palettes[0] = puVar1;
          uVar9 = (uint)(bVar17 >> 4);
          puVar13 = (uint16_t *)((ulong)(uVar9 & 4) + (long)puVar1);
          this->alt_ind_palettes[2] = puVar13;
          uVar9 = uVar9 & 0xfffffff8;
        }
        else {
          if ((MVar8 != LPixel) && (MVar8 != Pixel)) break;
          bVar17 = -((char)puVar4[uVar22 + 2] >> 7);
          uVar9 = puVar4[uVar22 + 2] & 0x40;
          this->two_colour_mask_ = ~(bVar17 + (char)uVar9 * '\x02');
          this->alt_ind_palettes[0] = puVar1;
          puVar13 = puVar1 + (ulong)bVar17 * 2;
          this->alt_ind_palettes[2] = puVar13;
          uVar9 = uVar9 >> 3;
        }
        this->alt_ind_palettes[1] = (uint16_t *)((ulong)uVar9 + (long)puVar1);
        this->alt_ind_palettes[3] = (uint16_t *)((long)puVar13 + (ulong)uVar9);
        break;
      case 2:
        bVar17 = puVar4[uVar22 + 4];
        this->start_line_data_pointer_[0] = (ushort)bVar17;
        uVar7 = CONCAT11(puVar4[uVar22 + 5],bVar17);
        this->start_line_data_pointer_[0] = uVar7;
        this->line_data_pointer_[0] = uVar7;
        uVar6 = puVar4[uVar22 + 5];
        goto LAB_003057b8;
      case 3:
        bVar17 = puVar4[uVar22 + 6];
        this->start_line_data_pointer_[1] = (ushort)bVar17;
        uVar7 = CONCAT11(puVar4[uVar22 + 7],bVar17);
        this->start_line_data_pointer_[1] = uVar7;
        this->line_data_pointer_[1] = uVar7;
        uVar6 = puVar4[uVar22 + 7];
LAB_003057b8:
        this->last_read_ = uVar6;
      }
switchD_003056ba_default:
      this->output_duration_ = this->output_duration_ + 1;
      this->line_data_pointer_[0] =
           this->line_data_pointer_[0] +
           (short)this->line_data_per_column_increments_[0] * (ushort)this->is_sync_or_pixels_;
      this->line_data_pointer_[1] =
           this->line_data_pointer_[1] +
           (ushort)this->is_sync_or_pixels_ * (short)this->line_data_per_column_increments_[1];
      uVar20 = uVar20 + 1;
      if (uVar20 == this->left_margin_) {
        this->is_sync_or_pixels_ = true;
      }
      if (uVar20 == this->right_margin_) {
        this->is_sync_or_pixels_ = false;
      }
    }
    if ((int)uVar21 < (int)uVar26) {
      uVar21 = uVar26;
    }
    uVar22 = (ulong)uVar21;
    if (uVar21 == 4) {
      OVar18 = this->is_sync_or_pixels_ ^ Blank;
      if (this->mode_ != Vsync) {
        OVar18 = Blank;
      }
      set_output_type(this,OVar18,false);
    }
    if (this->mode_ == Vsync) {
      if (3 < (int)uVar21) {
        while (iVar10 = (int)uVar22, iVar10 < (int)uVar19) {
          uVar21 = this->left_margin_;
          uVar26 = uVar19;
          if ((int)uVar21 < (int)uVar19) {
            uVar26 = uVar21;
          }
          if ((int)uVar21 <= iVar10) {
            uVar26 = uVar19;
          }
          uVar20 = this->right_margin_;
          uVar9 = uVar20;
          if ((int)uVar26 <= (int)uVar20) {
            uVar9 = uVar26;
          }
          if (iVar10 < (int)uVar20) {
            uVar26 = uVar9;
          }
          this->output_duration_ = this->output_duration_ + (uVar26 - iVar10);
          bVar17 = this->is_sync_or_pixels_;
          sVar5 = (short)(uVar26 - iVar10) * (ushort)bVar17;
          this->line_data_pointer_[0] =
               this->line_data_pointer_[0] +
               (short)this->line_data_per_column_increments_[0] * sVar5;
          this->line_data_pointer_[1] =
               this->line_data_pointer_[1] +
               sVar5 * (short)this->line_data_per_column_increments_[1];
          if ((uVar26 == uVar21 || uVar26 == uVar20) && uVar26 != 0x39) {
            bVar17 = uVar26 == 0x39 || uVar26 != uVar20;
            this->is_sync_or_pixels_ = (bool)bVar17;
          }
          set_output_type(this,(uint)(bVar17 ^ 1),false);
          uVar22 = (ulong)uVar26;
        }
      }
    }
    else {
      lVar15 = (long)(int)uVar19;
      lVar25 = 4;
      if (lVar15 < 4) {
        lVar25 = lVar15;
      }
      if (lVar25 <= (int)uVar26) {
        lVar25 = (long)(int)uVar26;
      }
      uVar14 = lVar25 * 2;
      uVar16 = uVar14 & 0xffffffff;
      lVar23 = 0;
      while( true ) {
        uVar22 = lVar25 + lVar23;
        iVar10 = this->first_pixel_window_;
        if ((lVar15 <= (long)uVar22) || ((long)iVar10 <= (long)uVar22)) break;
        if (lVar25 + lVar23 == 6) {
          set_output_type(this,ColourBurst,false);
        }
        if (((long)uVar22 < 8) && (this->should_reload_line_parameters_ != false)) {
          if (0xe < (int)uVar16) {
            __assert_fail("base < 7",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Enterprise/Nick.cpp"
                          ,0x131,"void Enterprise::Nick::run_for(Cycles)");
          }
          puVar4 = this->ram_;
          uVar7 = anon_unknown.dwarf_b5cc96::mapped_colour
                            (puVar4[lVar23 * 2 + uVar14 + this->line_parameter_pointer_]);
          *(uint16_t *)(this->line_data_per_column_increments_ + lVar25 + lVar23 + 5) = uVar7;
          uVar7 = anon_unknown.dwarf_b5cc96::mapped_colour
                            (puVar4[lVar23 * 2 + uVar14 + this->line_parameter_pointer_ + 1]);
          *(uint16_t *)
           ((long)this->line_data_per_column_increments_ + lVar23 * 4 + lVar25 * 4 + 0x16) = uVar7;
          this->last_read_ = puVar4[lVar23 * 2 + uVar14 + this->line_parameter_pointer_ + 1];
        }
        this->output_duration_ = this->output_duration_ + 1;
        this->line_data_pointer_[0] =
             this->line_data_pointer_[0] +
             (short)this->line_data_per_column_increments_[0] * (ushort)this->is_sync_or_pixels_;
        this->line_data_pointer_[1] =
             this->line_data_pointer_[1] +
             (ushort)this->is_sync_or_pixels_ * (short)this->line_data_per_column_increments_[1];
        iVar10 = (int)lVar25 + (int)lVar23 + 1;
        if ((uVar22 != 0x38) && (iVar10 == this->left_margin_)) {
          this->is_sync_or_pixels_ = true;
        }
        if ((uVar22 != 0x38) && (iVar10 == this->right_margin_)) {
          this->is_sync_or_pixels_ = false;
        }
        lVar23 = lVar23 + 1;
        uVar16 = (ulong)((int)uVar16 + 2);
      }
      if ((long)iVar10 <= (long)uVar22) {
        if ((int)uVar22 != iVar10) goto LAB_00305bb9;
        OVar18 = (OutputType)this->is_sync_or_pixels_;
LAB_00305ba6:
        do {
          set_output_type(this,OVar18 & Blank ^ Border,false);
LAB_00305bb9:
          iVar10 = (int)uVar22;
          if ((int)uVar19 <= iVar10) break;
          uVar21 = this->left_margin_;
          uVar26 = uVar19;
          if ((int)uVar21 < (int)uVar19) {
            uVar26 = uVar21;
          }
          uVar20 = this->right_margin_;
          if ((int)uVar21 <= iVar10) {
            uVar26 = uVar19;
          }
          uVar9 = uVar26;
          if ((int)uVar20 < (int)uVar26) {
            uVar9 = uVar20;
          }
          if ((int)uVar20 <= iVar10) {
            uVar9 = uVar26;
          }
          bVar2 = this->is_sync_or_pixels_;
          OVar18 = (OutputType)bVar2;
          iVar10 = uVar9 - iVar10;
          if (bVar2 != true) {
            this->output_duration_ = this->output_duration_ + iVar10;
            sVar5 = (ushort)bVar2 * (short)iVar10;
            this->line_data_pointer_[0] =
                 this->line_data_pointer_[0] +
                 (short)this->line_data_per_column_increments_[0] * sVar5;
            this->line_data_pointer_[1] =
                 this->line_data_pointer_[1] +
                 sVar5 * (short)this->line_data_per_column_increments_[1];
            if (uVar9 == uVar21 && uVar9 != 0x39) {
              this->is_sync_or_pixels_ = true;
              OVar18 = Blank;
            }
            else {
              uVar22 = 0x39;
              if (uVar9 == 0x39) goto LAB_00305ba6;
            }
            uVar22 = (ulong)uVar9;
            if (uVar9 == uVar20) {
              this->is_sync_or_pixels_ = false;
              OVar18 = Sync;
              uVar22 = (ulong)uVar20;
            }
            goto LAB_00305ba6;
          }
          while (iVar10 != 0) {
            if (this->pixel_pointer_ == (uint16_t *)0x0) {
              if (this->output_duration_ != 0) {
                set_output_type(this,Pixels,true);
              }
              puVar13 = (uint16_t *)Outputs::CRT::CRT::begin_data(&this->crt_,0x150,1);
              this->allocated_pointer_ = puVar13;
              this->pixel_pointer_ = puVar13;
              target = puVar13;
            }
            else {
              puVar13 = this->allocated_pointer_;
              target = this->pixel_pointer_;
            }
            if (puVar13 == (uint16_t *)0x0) {
              this->output_duration_ = this->output_duration_ + iVar10;
              OVar18 = (OutputType)this->is_sync_or_pixels_;
              sVar5 = (ushort)this->is_sync_or_pixels_ * (short)iVar10;
              this->line_data_pointer_[0] =
                   this->line_data_pointer_[0] +
                   (short)this->line_data_per_column_increments_[0] * sVar5;
              this->line_data_pointer_[1] =
                   this->line_data_pointer_[1] +
                   sVar5 * (short)this->line_data_per_column_increments_[1];
              uVar21 = (int)uVar22 + iVar10;
              if ((uVar21 != 0x39) && (uVar21 == this->left_margin_)) {
                this->is_sync_or_pixels_ = true;
                OVar18 = Blank;
              }
              iVar10 = 0;
            }
            else {
              uVar14 = (ulong)((long)puVar13 + (0x2a0 - (long)target)) >> 1;
              iVar11 = (int)((long)((ulong)(uint)((int)uVar14 >> 0x1f) << 0x20 | uVar14 & 0xffffffff
                                   ) / (long)this->column_size_);
              if (iVar10 <= iVar11) {
                iVar11 = iVar10;
              }
              iVar3 = this->bpp_;
              switch(this->mode_) {
              case Attr:
                if (iVar3 == 2) {
                  output_attributed<2>(this,target,iVar11);
                }
                else if (iVar3 == 4) {
                  output_attributed<4>(this,target,iVar11);
                }
                else if (iVar3 == 8) {
                  output_attributed<8>(this,target,iVar11);
                }
                else {
                  output_attributed<1>(this,target,iVar11);
                }
                break;
              case CH256:
                if (iVar3 == 2) {
                  output_character<2,8>(this,target,iVar11);
                }
                else if (iVar3 == 4) {
                  output_character<4,8>(this,target,iVar11);
                }
                else if (iVar3 == 8) {
                  output_character<8,8>(this,target,iVar11);
                }
                else {
                  output_character<1,8>(this,target,iVar11);
                }
                break;
              case CH128:
                if (iVar3 == 2) {
                  output_character<2,7>(this,target,iVar11);
                }
                else if (iVar3 == 4) {
                  output_character<4,7>(this,target,iVar11);
                }
                else if (iVar3 == 8) {
                  output_character<8,7>(this,target,iVar11);
                }
                else {
                  output_character<1,7>(this,target,iVar11);
                }
                break;
              case CH64:
                if (iVar3 == 2) {
                  output_character<2,6>(this,target,iVar11);
                }
                else if (iVar3 == 4) {
                  output_character<4,6>(this,target,iVar11);
                }
                else if (iVar3 == 8) {
                  output_character<8,6>(this,target,iVar11);
                }
                else {
                  output_character<1,6>(this,target,iVar11);
                }
                break;
              default:
                if (iVar3 == 2) {
                  output_pixel<2,false>(this,target,iVar11);
                }
                else if (iVar3 == 4) {
                  output_pixel<4,false>(this,target,iVar11);
                }
                else if (iVar3 == 8) {
                  output_pixel<8,false>(this,target,iVar11);
                }
                else {
                  output_pixel<1,false>(this,target,iVar11);
                }
                break;
              case LPixel:
                if (iVar3 == 2) {
                  output_pixel<2,true>(this,target,iVar11);
                }
                else if (iVar3 == 4) {
                  output_pixel<4,true>(this,target,iVar11);
                }
                else if (iVar3 == 8) {
                  output_pixel<8,true>(this,target,iVar11);
                }
                else {
                  output_pixel<1,true>(this,target,iVar11);
                }
              }
              puVar13 = this->pixel_pointer_;
              this->pixel_pointer_ = puVar13 + (long)iVar11 * (long)this->column_size_;
              this->output_duration_ = this->output_duration_ + iVar11;
              if ((long)(puVar13 + (long)iVar11 * (long)this->column_size_) -
                  (long)this->allocated_pointer_ == 0x2a0) {
                set_output_type(this,Pixels,true);
              }
              OVar18 = (OutputType)this->is_sync_or_pixels_;
              sVar5 = (ushort)this->is_sync_or_pixels_ * (short)iVar11;
              this->line_data_pointer_[0] =
                   this->line_data_pointer_[0] +
                   (short)this->line_data_per_column_increments_[0] * sVar5;
              this->line_data_pointer_[1] =
                   this->line_data_pointer_[1] +
                   sVar5 * (short)this->line_data_per_column_increments_[1];
              uVar21 = (int)uVar22 + iVar11;
              if ((uVar21 != 0x39) && (uVar21 == this->left_margin_)) {
                this->is_sync_or_pixels_ = true;
                OVar18 = Blank;
              }
              iVar10 = iVar10 - iVar11;
            }
            uVar22 = (ulong)uVar21;
            if ((uVar21 != 0x39) && (uVar21 == this->right_margin_)) {
              this->is_sync_or_pixels_ = false;
              OVar18 = Sync;
            }
          }
        } while( true );
      }
    }
    if (this->horizontal_counter_ == 0) {
      if ((int)uVar22 != 0x39) {
        __assert_fail("window == 57",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Enterprise/Nick.cpp"
                      ,0x18e,"void Enterprise::Nick::run_for(Cycles)");
      }
      puVar4 = &this->lines_remaining_;
      *puVar4 = *puVar4 + '\x01';
      if (*puVar4 == '\0') {
        this->should_reload_line_parameters_ = true;
        if (this->reload_line_parameter_pointer_ == true) {
          this->line_parameter_pointer_ = this->line_parameter_base_;
        }
        else {
          this->line_parameter_pointer_ = this->line_parameter_pointer_ + 0x10;
        }
      }
      else {
        this->should_reload_line_parameters_ = false;
      }
      MVar8 = this->mode_;
      if (MVar8 < 8) {
        if ((0x38U >> (MVar8 & 0x1f) & 1) == 0) {
          if (((0x86U >> (MVar8 & 0x1f) & 1) != 0) && (this->vres_ == false)) {
            this->line_data_pointer_[0] = this->start_line_data_pointer_[0];
          }
        }
        else {
          this->line_data_pointer_[0] = this->start_line_data_pointer_[0];
          this->line_data_pointer_[1] = this->line_data_pointer_[1] + 1;
        }
      }
    }
  } while( true );
}

Assistant:

void Nick::run_for(Cycles duration) {
	constexpr int line_length = 912;

#define add_window(x)															\
	line_data_pointer_[0] += is_sync_or_pixels_ * line_data_per_column_increments_[0] * (x);	\
	line_data_pointer_[1] += is_sync_or_pixels_ * line_data_per_column_increments_[1] * (x);	\
	window += x;																\
	if(window != 57 && window == left_margin_) is_sync_or_pixels_ = true;		\
	if(window != 57 && window == right_margin_) is_sync_or_pixels_ = false;

	int clocks_remaining = duration.as<int>();
	while(clocks_remaining) {
		// Determine how many cycles are left this line.
		const int clocks_this_line = std::min(clocks_remaining, line_length - horizontal_counter_);

		// Convert that into a [start/current] and end window.
		int window = horizontal_counter_ >> 4;
		const int end_window = (horizontal_counter_ + clocks_this_line) >> 4;

		// Advance the line counters.
		clocks_remaining -= clocks_this_line;
		horizontal_counter_ = (horizontal_counter_ + clocks_this_line) % line_length;

		// Do nothing if a window boundary isn't crossed.
		if(window == end_window) continue;

		// HSYNC is signalled for four windows at the start of the line.
		// I currently believe this happens regardless of Vsync mode.
		if(!window) {
			set_output_type(OutputType::Sync);

			// There's no increment to get to 0, it happens when the horizontal_counter_
			// is reset. So test for active bit effect manually.
			if(!left_margin_) is_sync_or_pixels_ = true;
			if(!right_margin_) is_sync_or_pixels_ = false;
		}

		// Default to noting read.
		last_read_ = 0xff;

		while(window < 4 && window < end_window) {
			if(should_reload_line_parameters_) {
				switch(window) {
					// First slot: line count, mode and interrupt flag.
					case 0:
						// Byte 0: lines remaining.
						lines_remaining_ = ram_[line_parameter_pointer_];

						// Byte 1: current interrupt output plus graphics modes...
						last_read_ = ram_[line_parameter_pointer_ + 1];

						// Set the new interrupt line output.
						interrupt_line_ = ram_[line_parameter_pointer_ + 1] & 0x80;

						// Determine the mode and depth, and hence the column size.
						mode_ = Mode((ram_[line_parameter_pointer_ + 1] >> 1)&7);
						bpp_ = 1 << ((ram_[line_parameter_pointer_ + 1] >> 5)&3);
						switch(mode_) {
							default:
							case Mode::Pixel:
								column_size_ = 16 / bpp_;
								line_data_per_column_increments_[0] = 2;
								line_data_per_column_increments_[1] = 0;
							break;

							case Mode::LPixel:
							case Mode::CH64:
							case Mode::CH128:
							case Mode::CH256:
								column_size_ = 8 / bpp_;
								line_data_per_column_increments_[0] = 1;
								line_data_per_column_increments_[1] = 0;
							break;

							case Mode::Attr:
								column_size_ = 8;
								line_data_per_column_increments_[0] = 1;
								line_data_per_column_increments_[1] = 1;
							break;
						}

						vres_ = ram_[line_parameter_pointer_ + 1] & 0x10;
						reload_line_parameter_pointer_ = ram_[line_parameter_pointer_ + 1] & 0x01;
					break;

					// Second slot: margins and ALT/IND bits.
					case 1:
						// Determine the margins.
						left_margin_ = ram_[line_parameter_pointer_ + 2] & 0x3f;
						right_margin_ = ram_[line_parameter_pointer_ + 3] & 0x3f;
						last_read_ = ram_[line_parameter_pointer_ + 3];

						// Set up the alternative palettes,
						switch(mode_) {
							default:
							break;

							// NB: LSBALT/MSBALT and ALTIND0/ALTIND1 appear to have opposite effects on palette selection.

							case Mode::Pixel:
							case Mode::LPixel: {
								const uint8_t flags = ram_[line_parameter_pointer_ + 2];

								// Use MSBALT and LSBALT to pick the alt_ind_palettes.
								//
								// LSBALT = b6 of params[2], if set => character codes with bit 6 set should use palette indices 4... instead of 0... .
								// MSBALT = b7 of params[2], if set => character codes with bit 7 set should use palette indices 2 and 3.
								two_colour_mask_ = 0xff &~ (((flags&0x80) >> 7) | ((flags&0x40) << 1));

								alt_ind_palettes[0] = palette_;
								alt_ind_palettes[2] = alt_ind_palettes[0] + ((flags & 0x80) ? 2 : 0);

								alt_ind_palettes[1] = alt_ind_palettes[0] + ((flags & 0x40) ? 4 : 0);
								alt_ind_palettes[3] = alt_ind_palettes[2] + ((flags & 0x40) ? 4 : 0);
							} break;

							case Mode::CH64:
							case Mode::CH128:
							case Mode::CH256: {
								const uint8_t flags = ram_[line_parameter_pointer_ + 3];

								// Use ALTIND0 and ALTIND1 to pick the alt_ind_palettes.
								//
								// ALTIND1 = b6 of params[3], if set => character codes with bit 7 set should use palette indices 2 and 3.
								// ALTIND0 = b7 of params[3], if set => character codes with bit 6 set should use palette indices 4... instead of 0... .
								alt_ind_palettes[0] = palette_;
								alt_ind_palettes[2] = alt_ind_palettes[0] + ((flags & 0x40) ? 2 : 0);

								alt_ind_palettes[1] = alt_ind_palettes[0] + ((flags & 0x80) ? 4 : 0);
								alt_ind_palettes[3] = alt_ind_palettes[2] + ((flags & 0x80) ? 4 : 0);
							} break;
						}
					break;

					// Third slot: Line data pointer 1.
					case 2:
						start_line_data_pointer_[0] = ram_[line_parameter_pointer_ + 4];
						start_line_data_pointer_[0] |= ram_[line_parameter_pointer_ + 5] << 8;

						line_data_pointer_[0] = start_line_data_pointer_[0];
						last_read_ = ram_[line_parameter_pointer_ + 5];
					break;

					// Fourth slot: Line data pointer 2.
					case 3:
						start_line_data_pointer_[1] = ram_[line_parameter_pointer_ + 6];
						start_line_data_pointer_[1] |= ram_[line_parameter_pointer_ + 7] << 8;

						line_data_pointer_[1] = start_line_data_pointer_[1];
						last_read_ = ram_[line_parameter_pointer_ + 7];
					break;
				}
			}

			++output_duration_;
			add_window(1);
		}
		if(window == 4) {
			if(mode_ == Mode::Vsync) {
				set_output_type(is_sync_or_pixels_ ? OutputType::Sync : OutputType::Blank);
			} else {
				set_output_type(OutputType::Blank);
			}
		}

		// Deal with vsync mode out here.
		if(mode_ == Mode::Vsync) {
			if(window >= 4) {
				while(window < end_window) {
					// Skip straight to the next event.
					int next_event = end_window;
					if(window < left_margin_) next_event = std::min(next_event, left_margin_);
					if(window < right_margin_) next_event = std::min(next_event, right_margin_);

					output_duration_ += next_event - window;
					add_window(next_event - window);
					set_output_type(is_sync_or_pixels_ ? OutputType::Sync : OutputType::Blank);
				}
			}
		} else {
			// If present then the colour burst is output for the period from
			// the start of window 6 to the end of window 10.
			//
			// The first 8 palette entries also need to be fetched here.
			while(window < first_pixel_window_ && window < end_window) {
				if(window == 6) {
					set_output_type(OutputType::ColourBurst);
				}

				if(should_reload_line_parameters_ && window < 8) {
					const int base = (window - 4) << 1;
					assert(base < 7);
					palette_[base] = mapped_colour(ram_[line_parameter_pointer_ + base + 8]);
					palette_[base + 1] = mapped_colour(ram_[line_parameter_pointer_ + base + 9]);
					last_read_ = ram_[line_parameter_pointer_ + base + 9];
				}

				++output_duration_;
				add_window(1);
			}

			if(window >= first_pixel_window_) {
				if(window == first_pixel_window_) {
					set_output_type(is_sync_or_pixels_ ? OutputType::Pixels : OutputType::Border);
				}

				while(window < end_window) {
					int next_event = end_window;
					if(window < left_margin_) next_event = std::min(next_event, left_margin_);
					if(window < right_margin_) next_event = std::min(next_event, right_margin_);

					if(is_sync_or_pixels_) {

#define DispatchBpp(func) \
	switch(bpp_) {	\
		default:	\
		case 1: func(1)(pixel_pointer_, output_duration);	break;	\
		case 2: func(2)(pixel_pointer_, output_duration);	break;	\
		case 4: func(4)(pixel_pointer_, output_duration);	break;	\
		case 8: func(8)(pixel_pointer_, output_duration);	break;	\
	}

#define pixel(x) output_pixel<x, false>
#define lpixel(x) output_pixel<x, true>
#define ch256(x) output_character<x, 8>
#define ch128(x) output_character<x, 7>
#define ch64(x) output_character<x, 6>
#define attr(x) output_attributed<x>

						int columns_remaining = next_event - window;
						while(columns_remaining) {
							if(!pixel_pointer_) {
								if(output_duration_) {
									set_output_type(OutputType::Pixels, true);
								}
								pixel_pointer_ = allocated_pointer_ = reinterpret_cast<uint16_t *>(crt_.begin_data(allocation_size));
							}

							if(allocated_pointer_) {
								const int output_duration = std::min(columns_remaining, int(allocated_pointer_ + allocation_size - pixel_pointer_) / column_size_);

								switch(mode_) {
									default:
									case Mode::Pixel:	DispatchBpp(pixel);		break;
									case Mode::LPixel:	DispatchBpp(lpixel);	break;
									case Mode::CH256:	DispatchBpp(ch256);		break;
									case Mode::CH128:	DispatchBpp(ch128);		break;
									case Mode::CH64:	DispatchBpp(ch64);		break;
									case Mode::Attr:	DispatchBpp(attr);		break;
								}

								pixel_pointer_ += output_duration * column_size_;
								output_duration_ += output_duration;
								if(pixel_pointer_ - allocated_pointer_ == allocation_size) {
									set_output_type(OutputType::Pixels, true);
								}
								columns_remaining -= output_duration;
								add_window(output_duration);
							} else {
								output_duration_ += columns_remaining;
								add_window(columns_remaining);
								columns_remaining = 0;
							}
						}

#undef attr
#undef ch64
#undef ch128
#undef ch256
#undef pixel
#undef lpixel
#undef DispatchBpp
					} else {
						output_duration_ += next_event - window;
						add_window(next_event - window);
					}

					set_output_type(is_sync_or_pixels_ ? OutputType::Pixels : OutputType::Border);
				}
			}
		}

		// Check for end of line.
		if(!horizontal_counter_) {
			assert(window == 57);

			++lines_remaining_;
			if(!lines_remaining_) {
				should_reload_line_parameters_ = true;

				// Check for end-of-frame.
				if(reload_line_parameter_pointer_) {
					line_parameter_pointer_ = line_parameter_base_;
				} else {
					line_parameter_pointer_ += 16;
				}
			} else {
				should_reload_line_parameters_ = false;
			}

			// Deal with VRES and other address reloading, dependant upon mode.
			switch(mode_) {
				default: break;
				case Mode::CH64:
				case Mode::CH128:
				case Mode::CH256:
					line_data_pointer_[0] = start_line_data_pointer_[0];
					++line_data_pointer_[1];
				break;

				case Mode::Pixel:
				case Mode::LPixel:
				case Mode::Attr:
					// Reload the pixel or attribute address if VRES is clear.
					if(!vres_) {
						line_data_pointer_[0] = start_line_data_pointer_[0];
					}
				break;
			}
		}
	}

#undef add_window

}